

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O1

int pronoun_gender(level *lev,monst *mtmp)

{
  uint uVar1;
  permonst *ppVar2;
  boolean bVar3;
  int iVar4;
  obj *poVar5;
  uint uVar6;
  
  uVar6 = 2;
  if ((mtmp->data->mflags2 & 0x40000) != 0) {
    return 2;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0)))))) {
LAB_001ecae2:
      uVar1 = *(uint *)&mtmp->field_0x60;
      if (((uVar1 & 2) == 0) || ((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0))))
      {
        if ((uVar1 & 0x280) == 0) goto LAB_001ecb2b;
      }
      else if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001ecb2b:
        if ((u._1052_1_ & 0x20) == 0) goto LAB_001ecc9e;
      }
    }
  }
  else {
    bVar3 = worm_known(lev,mtmp);
    if (bVar3 != '\0') goto LAB_001ecae2;
  }
  if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
       ((poVar5 = which_armor(mtmp,4), poVar5 != (obj *)0x0 &&
        (poVar5 = which_armor(mtmp,4), poVar5->otyp == 0x4f)))) ||
      ((((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
         ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
           (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
           youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar4)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar3 = match_warn_of_mon(mtmp), bVar3 == '\0')))) {
    return 2;
  }
LAB_001ecc9e:
  ppVar2 = mtmp->data;
  if ((((ppVar2->mflags1 & 0x20000) != 0) || ((ppVar2->geno & 0x1000) != 0)) ||
     ((ppVar2->mflags2 & 0x80000) != 0)) {
    uVar6 = *(uint *)&mtmp->field_0x60 & 1;
  }
  return uVar6;
}

Assistant:

int pronoun_gender(const struct level *lev, struct monst *mtmp)
{
	if (is_neuter(mtmp->data) || !canspotmon(lev, mtmp)) return 2;
	return (humanoid(mtmp->data) || (mtmp->data->geno & G_UNIQ) ||
		type_is_pname(mtmp->data)) ? (int)mtmp->female : 2;
}